

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O0

bool __thiscall Kernel::RobSubstitution::isUnbound(RobSubstitution *this,VarSpec v)

{
  bool bVar1;
  TermSpec *in_RDI;
  VarSpec VVar2;
  Option<const_Kernel::TermSpec_&> binding;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  TermList in_stack_ffffffffffffffc8;
  
  while( true ) {
    Lib::DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>::find
              ((DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               in_stack_ffffffffffffffc8._content,
               (VarSpec *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    bVar1 = Lib::Option<const_Kernel::TermSpec_&>::isNone
                      ((Option<const_Kernel::TermSpec_&> *)0x95a62e);
    if (bVar1) {
      return true;
    }
    Lib::Option<const_Kernel::TermSpec_&>::operator->((Option<const_Kernel::TermSpec_&> *)0x95a645);
    bVar1 = Kernel::TermSpec::isTerm((TermSpec *)0x95a64d);
    if (bVar1) break;
    Lib::Option<const_Kernel::TermSpec_&>::operator->((Option<const_Kernel::TermSpec_&> *)0x95a666);
    VVar2 = Kernel::TermSpec::varSpec(in_RDI);
    in_stack_ffffffffffffffc8 = VVar2._self._content;
    in_stack_ffffffffffffffc0 = VVar2.index;
  }
  return false;
}

Assistant:

bool RobSubstitution::isUnbound(VarSpec v) const
{
  for(;;) {
    auto binding = _bindings.find(v);
    if(binding.isNone()) {
      return true;
    } else if(binding->isTerm()) {
      return false;
    }
    v = binding->varSpec();
  }
}